

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

void apprun_print_envp(char **envp)

{
  char **ppcVar1;
  
  fwrite("  envp: [ \n",0xb,1,_stderr);
  if (envp != (char **)0x0) {
    for (ppcVar1 = envp + 1; ppcVar1[-1] != (char *)0x0; ppcVar1 = ppcVar1 + 1) {
      fprintf(_stderr,"    \"%s\"");
      if (*ppcVar1 != (char *)0x0) {
        fwrite(", \n",3,1,_stderr);
      }
    }
  }
  fwrite("\n  ]\n",5,1,_stderr);
  return;
}

Assistant:

void apprun_print_envp(char *const *envp) {
    fprintf(stderr, "  envp: [ \n");
    if (envp) {
        for (char *const *itr = envp; *itr != 0; itr++) {
            fprintf(stderr, "    \"%s\"", *itr);
            if (*(itr + 1) != NULL)
                fprintf(stderr, ", \n");
        }
    }
    fprintf(stderr, "\n  ]\n");
}